

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.h
# Opt level: O1

void __thiscall AsyncLogging::~AsyncLogging(AsyncLogging *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  
  if (this->running_ == true) {
    this->running_ = false;
    pthread_cond_signal((pthread_cond_t *)&(this->cond_).cond);
    Thread::join(&this->thread_);
  }
  pthread_cond_destroy((pthread_cond_t *)&(this->latch_).condition_.cond);
  pthread_mutex_destroy((pthread_mutex_t *)&(this->latch_).mutex_);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::~vector(&this->buffers_);
  this_00 = (this->currentBuffer_).
            super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pthread_cond_destroy((pthread_cond_t *)&(this->cond_).cond);
  pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
  Thread::~Thread(&this->thread_);
  pcVar1 = (this->basename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->basename_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~AsyncLogging() {
        if(running_) stop();
    }